

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3FindInIndex(Parse *pParse,Expr *pX,u32 inFlags,int *prRhsHasNull,int *aiMap,int *piTab)

{
  byte bVar1;
  byte bVar2;
  LogEst LVar3;
  short sVar4;
  ushort uVar5;
  ExprList *pEVar6;
  SrcList *pSVar7;
  Table *pTab;
  Schema *pSVar8;
  undefined1 auVar9 [16];
  u8 uVar10;
  char cVar11;
  int iVar12;
  uint uVar13;
  Vdbe *p;
  Select *pSVar14;
  Expr *pEVar15;
  Expr *pLeft;
  CollSeq *pCVar16;
  char aff2;
  Schema **ppSVar17;
  long lVar18;
  ulong uVar19;
  Op *pOVar20;
  int regHasNull;
  int iVar21;
  long lVar22;
  int iCur;
  ExprList_item *pEVar23;
  uint uVar24;
  ulong uVar25;
  Index *pIdx;
  long in_FS_OFFSET;
  bool bVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int *local_b8;
  Walker local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p = sqlite3GetVdbe(pParse);
  iCur = pParse->nTab;
  pParse->nTab = iCur + 1;
  iVar21 = 0;
  if (prRhsHasNull == (int *)0x0) {
    local_b8 = (int *)0x0;
  }
  else {
    local_b8 = prRhsHasNull;
    if ((pX->flags & 0x1000) != 0) {
      pEVar6 = ((pX->x).pSelect)->pEList;
      uVar13 = pEVar6->nExpr;
      if ((int)uVar13 < 1) {
        uVar24 = 0;
      }
      else {
        pEVar23 = pEVar6->a;
        uVar25 = 0;
        do {
          iVar12 = sqlite3ExprCanBeNull(pEVar23->pExpr);
          if (iVar12 != 0) goto LAB_0017dadc;
          uVar25 = uVar25 + 1;
          pEVar23 = pEVar23 + 1;
        } while (uVar13 != uVar25);
        uVar25 = (ulong)uVar13;
LAB_0017dadc:
        uVar24 = (uint)uVar25;
      }
      local_b8 = prRhsHasNull;
      if (uVar24 == uVar13) {
        local_b8 = (int *)0x0;
      }
    }
  }
  if (pParse->nErr == 0) {
    iVar21 = 0;
    if ((((((pX->flags & 0x1040) == 0x1000) &&
          (pSVar14 = (pX->x).pSelect, pSVar14->pPrior == (Select *)0x0)) &&
         ((pSVar14->selFlags & 9) == 0)) &&
        ((pSVar14->pLimit == (Expr *)0x0 && (pSVar14->pWhere == (Expr *)0x0)))) &&
       ((pSVar7 = pSVar14->pSrc, pSVar7->nSrc == 1 &&
        (((pSVar7->a[0].fg.field_0x1 & 4) == 0 && ((pSVar7->a[0].pSTab)->eTabType != '\x01')))))) {
      lVar18 = (long)pSVar14->pEList->nExpr;
      if (0 < lVar18) {
        lVar22 = 0;
        do {
          if (**(char **)((long)&pSVar14->pEList->a[0].pExpr + lVar22) != -0x58) goto LAB_0017db7c;
          lVar22 = lVar22 + 0x18;
        } while (lVar18 * 0x18 != lVar22);
      }
    }
    else {
LAB_0017db7c:
      pSVar14 = (Select *)0x0;
    }
    if (pSVar14 != (Select *)0x0) {
      pEVar6 = pSVar14->pEList;
      uVar13 = pEVar6->nExpr;
      pTab = pSVar14->pSrc->a[0].pSTab;
      if (pTab->pSchema == (Schema *)0x0) {
        iVar12 = -0x8000;
      }
      else {
        iVar12 = -1;
        ppSVar17 = &pParse->db->aDb->pSchema;
        do {
          iVar12 = iVar12 + 1;
          pSVar8 = *ppSVar17;
          ppSVar17 = ppSVar17 + 4;
        } while (pSVar8 != pTab->pSchema);
      }
      sqlite3CodeVerifySchema(pParse,iVar12);
      sqlite3TableLock(pParse,iVar12,pTab->tnum,'\0',pTab->zName);
      if ((uVar13 == 1) && ((pEVar6->a[0].pExpr)->iColumn < 0)) {
        iVar21 = sqlite3VdbeAddOp3(p,0xf,0,0,0);
        sqlite3OpenTable(pParse,iCur,iVar12,pTab,0x66);
        sqlite3VdbeExplain(pParse,'\0',"USING ROWID SEARCH ON TABLE %s FOR IN-OPERATOR",pTab->zName)
        ;
        if (p->db->mallocFailed == '\0') {
          pOVar20 = p->aOp + iVar21;
        }
        else {
          pOVar20 = (Op *)&sqlite3VdbeGetOp_dummy;
        }
        pOVar20->p2 = p->nOp;
        iVar21 = 1;
      }
      else {
        if ((int)uVar13 < 1) {
LAB_0017dea6:
          pIdx = pTab->pIndex;
          if (pIdx != (Index *)0x0) {
            do {
              uVar5 = pIdx->nColumn;
              iVar21 = 0;
              if (((((int)uVar13 <= (int)(uint)uVar5) && (iVar21 = 0, uVar5 < 0x3f)) &&
                  (iVar21 = 0, pIdx->pPartIdxWhere == (Expr *)0x0)) &&
                 (((inFlags & 4) == 0 ||
                  ((iVar21 = 0, (int)(uint)pIdx->nKeyCol <= (int)uVar13 &&
                   (((int)(uint)uVar5 <= (int)uVar13 || (iVar21 = 0, pIdx->onError != '\0')))))))) {
                if (0 < (int)uVar13) {
                  lVar18 = 0;
                  uVar25 = 0;
LAB_0017df35:
                  pLeft = sqlite3VectorFieldSubexpr(pX->pLeft,(int)lVar18);
                  pEVar15 = pEVar6->a[lVar18].pExpr;
                  pCVar16 = sqlite3BinaryCompareCollSeq(pParse,pLeft,pEVar15);
                  uVar19 = 0;
LAB_0017df74:
                  if (pIdx->aiColumn[uVar19] != pEVar15->iColumn) goto LAB_0017dfb7;
                  if (pCVar16 != (CollSeq *)0x0) {
                    lVar22 = 0;
                    do {
                      bVar1 = pCVar16->zName[lVar22];
                      bVar2 = pIdx->azColl[uVar19][lVar22];
                      if (bVar1 == bVar2) {
                        if ((ulong)bVar1 == 0) goto LAB_0017dfb2;
                      }
                      else if (""[bVar1] != ""[bVar2]) goto LAB_0017dfb2;
                      lVar22 = lVar22 + 1;
                    } while( true );
                  }
                  goto LAB_0017dfc1;
                }
                uVar25 = 0;
LAB_0017e02f:
                iVar21 = 0;
                if ((uVar25 ^ -1L << ((byte)uVar13 & 0x3f)) == 0xffffffffffffffff) {
                  iVar21 = sqlite3VdbeAddOp3(p,0xf,0,0,0);
                  sqlite3VdbeExplain(pParse,'\0',"USING INDEX %s FOR IN-OPERATOR",pIdx->zName);
                  sqlite3VdbeAddOp3(p,0x66,iCur,pIdx->tnum,iVar12);
                  sqlite3VdbeSetP4KeyInfo(pParse,pIdx);
                  bVar1 = *pIdx->aSortOrder;
                  if (local_b8 != (int *)0x0) {
                    regHasNull = pParse->nMem + 1;
                    pParse->nMem = regHasNull;
                    *local_b8 = regHasNull;
                    if (uVar13 == 1) {
                      sqlite3SetHasNullFlag(p,iCur,regHasNull);
                    }
                  }
                  pOVar20 = (Op *)&sqlite3VdbeGetOp_dummy;
                  if (p->db->mallocFailed == '\0') {
                    pOVar20 = p->aOp + iVar21;
                  }
                  iVar21 = bVar1 + 3;
                  pOVar20->p2 = p->nOp;
                }
              }
              pIdx = pIdx->pNext;
            } while ((pIdx != (Index *)0x0) && (iVar21 == 0));
            goto LAB_0017db09;
          }
        }
        else {
          pEVar23 = pEVar6->a;
          uVar25 = 0;
          do {
            pEVar15 = sqlite3VectorFieldSubexpr(pX->pLeft,(int)uVar25);
            sVar4 = pEVar23->pExpr->iColumn;
            aff2 = 'D';
            if ((-1 < (long)sVar4) && (sVar4 < pTab->nCol)) {
              aff2 = pTab->aCol[sVar4].affinity;
            }
            cVar11 = sqlite3CompareAffinity(pEVar15,aff2);
            bVar26 = 1 < (byte)(cVar11 + 0xbfU);
            if (aff2 < 'C' && bVar26) break;
            uVar25 = uVar25 + 1;
            pEVar23 = pEVar23 + 1;
          } while (uVar25 < uVar13);
          if (aff2 >= 'C' || !bVar26) goto LAB_0017dea6;
        }
        iVar21 = 0;
      }
    }
  }
LAB_0017db09:
  if (iVar21 == 0) {
    iVar21 = 0;
    if (((inFlags & 1) != 0) && ((pX->flags & 0x1000) == 0)) {
      pEVar15 = pX->pLeft;
      pX->pLeft = (Expr *)0x0;
      local_68.u.pNC = (NameContext *)&DAT_aaaaaaaaaaaaaaaa;
      local_68.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)&DAT_aaaaaaaaaaaaaaaa;
      local_68.walkerDepth = -0x55555556;
      local_68.eCode = 1;
      local_68.mWFlags = 0xaaaa;
      local_68.xExprCallback = exprNodeIsConstant;
      local_68.xSelectCallback = sqlite3SelectWalkFail;
      local_68.pParse = pParse;
      if (pX != (Expr *)0x0) {
        sqlite3WalkExprNN(&local_68,pX);
      }
      pX->pLeft = pEVar15;
      if ((local_68.eCode == 0) || (iVar21 = 0, ((pX->x).pList)->nExpr < 3)) {
        pParse->nTab = pParse->nTab + -1;
        iVar21 = 5;
        iCur = -1;
      }
    }
  }
  if (iVar21 == 0) {
    LVar3 = pParse->nQueryLoop;
    if ((inFlags & 4) == 0) {
      if (local_b8 == (int *)0x0) goto LAB_0017dcb6;
      iVar21 = pParse->nMem + 1;
      pParse->nMem = iVar21;
      *local_b8 = iVar21;
    }
    else {
      pParse->nQueryLoop = 0;
LAB_0017dcb6:
      iVar21 = 0;
    }
    sqlite3CodeRhsOfIN(pParse,pX,iCur);
    if (iVar21 != 0) {
      sqlite3SetHasNullFlag(p,iCur,iVar21);
    }
    pParse->nQueryLoop = LVar3;
    iVar21 = 2;
  }
  auVar9 = _DAT_002010a0;
  if ((aiMap == (int *)0x0) || (0xfffffffd < iVar21 - 5U)) goto LAB_0017ddbc;
  pSVar14 = (Select *)pX->pLeft;
  uVar10 = pSVar14->op;
  if (uVar10 == 0xb0) {
    uVar10 = *(u8 *)&pSVar14->nSelectRow;
  }
  if (uVar10 == 0xb1) {
LAB_0017dd20:
    uVar13 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar14->pEList)->pList->nExpr;
  }
  else {
    uVar13 = 1;
    if (uVar10 == 0x8b) {
      pSVar14 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar14->pEList)->pSelect;
      goto LAB_0017dd20;
    }
  }
  if (0 < (int)uVar13) {
    lVar18 = (ulong)uVar13 - 1;
    auVar27._8_4_ = (int)lVar18;
    auVar27._0_8_ = lVar18;
    auVar27._12_4_ = (int)((ulong)lVar18 >> 0x20);
    uVar25 = 0;
    auVar27 = auVar27 ^ _DAT_002010a0;
    auVar28 = _DAT_00201090;
    do {
      auVar29 = auVar28 ^ auVar9;
      if ((bool)(~(auVar29._4_4_ == auVar27._4_4_ && auVar27._0_4_ < auVar29._0_4_ ||
                  auVar27._4_4_ < auVar29._4_4_) & 1)) {
        aiMap[uVar25] = (int)uVar25;
      }
      if ((auVar29._12_4_ != auVar27._12_4_ || auVar29._8_4_ <= auVar27._8_4_) &&
          auVar29._12_4_ <= auVar27._12_4_) {
        aiMap[uVar25 + 1] = (int)uVar25 + 1;
      }
      uVar25 = uVar25 + 2;
      lVar18 = auVar28._8_8_;
      auVar28._0_8_ = auVar28._0_8_ + 2;
      auVar28._8_8_ = lVar18 + 2;
    } while ((uVar13 + 1 & 0xfffffffe) != uVar25);
  }
LAB_0017ddbc:
  *piTab = iCur;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar21;
LAB_0017dfb2:
  if (bVar1 == bVar2) goto LAB_0017dfc1;
LAB_0017dfb7:
  uVar19 = uVar19 + 1;
  if (uVar19 == uVar13) goto code_r0x0017dfbf;
  goto LAB_0017df74;
code_r0x0017dfbf:
  uVar19 = (ulong)uVar13;
LAB_0017dfc1:
  if (((uint)uVar19 == uVar13) || ((uVar25 >> (uVar19 & 0x3f) & 1) != 0)) {
    bVar26 = false;
  }
  else {
    uVar25 = uVar25 | 1L << ((byte)uVar19 & 0x3f);
    bVar26 = true;
    if (aiMap != (int *)0x0) {
      aiMap[lVar18] = (uint)uVar19;
    }
  }
  if ((!bVar26) || (lVar18 = lVar18 + 1, (int)uVar13 <= lVar18)) goto LAB_0017e02f;
  goto LAB_0017df35;
}

Assistant:

SQLITE_PRIVATE int sqlite3FindInIndex(
  Parse *pParse,             /* Parsing context */
  Expr *pX,                  /* The IN expression */
  u32 inFlags,               /* IN_INDEX_LOOP, _MEMBERSHIP, and/or _NOOP_OK */
  int *prRhsHasNull,         /* Register holding NULL status.  See notes */
  int *aiMap,                /* Mapping from Index fields to RHS fields */
  int *piTab                 /* OUT: index to use */
){
  Select *p;                            /* SELECT to the right of IN operator */
  int eType = 0;                        /* Type of RHS table. IN_INDEX_* */
  int iTab;                             /* Cursor of the RHS table */
  int mustBeUnique;                     /* True if RHS must be unique */
  Vdbe *v = sqlite3GetVdbe(pParse);     /* Virtual machine being coded */

  assert( pX->op==TK_IN );
  mustBeUnique = (inFlags & IN_INDEX_LOOP)!=0;
  iTab = pParse->nTab++;

  /* If the RHS of this IN(...) operator is a SELECT, and if it matters
  ** whether or not the SELECT result contains NULL values, check whether
  ** or not NULL is actually possible (it may not be, for example, due
  ** to NOT NULL constraints in the schema). If no NULL values are possible,
  ** set prRhsHasNull to 0 before continuing.  */
  if( prRhsHasNull && ExprUseXSelect(pX) ){
    int i;
    ExprList *pEList = pX->x.pSelect->pEList;
    for(i=0; i<pEList->nExpr; i++){
      if( sqlite3ExprCanBeNull(pEList->a[i].pExpr) ) break;
    }
    if( i==pEList->nExpr ){
      prRhsHasNull = 0;
    }
  }

  /* Check to see if an existing table or index can be used to
  ** satisfy the query.  This is preferable to generating a new
  ** ephemeral table.  */
  if( pParse->nErr==0 && (p = isCandidateForInOpt(pX))!=0 ){
    sqlite3 *db = pParse->db;              /* Database connection */
    Table *pTab;                           /* Table <table>. */
    int iDb;                               /* Database idx for pTab */
    ExprList *pEList = p->pEList;
    int nExpr = pEList->nExpr;

    assert( p->pEList!=0 );             /* Because of isCandidateForInOpt(p) */
    assert( p->pEList->a[0].pExpr!=0 ); /* Because of isCandidateForInOpt(p) */
    assert( p->pSrc!=0 );               /* Because of isCandidateForInOpt(p) */
    pTab = p->pSrc->a[0].pSTab;

    /* Code an OP_Transaction and OP_TableLock for <table>. */
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
    assert( iDb>=0 && iDb<SQLITE_MAX_DB );
    sqlite3CodeVerifySchema(pParse, iDb);
    sqlite3TableLock(pParse, iDb, pTab->tnum, 0, pTab->zName);

    assert(v);  /* sqlite3GetVdbe() has always been previously called */
    if( nExpr==1 && pEList->a[0].pExpr->iColumn<0 ){
      /* The "x IN (SELECT rowid FROM table)" case */
      int iAddr = sqlite3VdbeAddOp0(v, OP_Once);
      VdbeCoverage(v);

      sqlite3OpenTable(pParse, iTab, iDb, pTab, OP_OpenRead);
      eType = IN_INDEX_ROWID;
      ExplainQueryPlan((pParse, 0,
            "USING ROWID SEARCH ON TABLE %s FOR IN-OPERATOR",pTab->zName));
      sqlite3VdbeJumpHere(v, iAddr);
    }else{
      Index *pIdx;                         /* Iterator variable */
      int affinity_ok = 1;
      int i;

      /* Check that the affinity that will be used to perform each
      ** comparison is the same as the affinity of each column in table
      ** on the RHS of the IN operator.  If it not, it is not possible to
      ** use any index of the RHS table.  */
      for(i=0; i<nExpr && affinity_ok; i++){
        Expr *pLhs = sqlite3VectorFieldSubexpr(pX->pLeft, i);
        int iCol = pEList->a[i].pExpr->iColumn;
        char idxaff = sqlite3TableColumnAffinity(pTab,iCol); /* RHS table */
        char cmpaff = sqlite3CompareAffinity(pLhs, idxaff);
        testcase( cmpaff==SQLITE_AFF_BLOB );
        testcase( cmpaff==SQLITE_AFF_TEXT );
        switch( cmpaff ){
          case SQLITE_AFF_BLOB:
            break;
          case SQLITE_AFF_TEXT:
            /* sqlite3CompareAffinity() only returns TEXT if one side or the
            ** other has no affinity and the other side is TEXT.  Hence,
            ** the only way for cmpaff to be TEXT is for idxaff to be TEXT
            ** and for the term on the LHS of the IN to have no affinity. */
            assert( idxaff==SQLITE_AFF_TEXT );
            break;
          default:
            affinity_ok = sqlite3IsNumericAffinity(idxaff);
        }
      }

      if( affinity_ok ){
        /* Search for an existing index that will work for this IN operator */
        for(pIdx=pTab->pIndex; pIdx && eType==0; pIdx=pIdx->pNext){
          Bitmask colUsed;      /* Columns of the index used */
          Bitmask mCol;         /* Mask for the current column */
          if( pIdx->nColumn<nExpr ) continue;
          if( pIdx->pPartIdxWhere!=0 ) continue;
          /* Maximum nColumn is BMS-2, not BMS-1, so that we can compute
          ** BITMASK(nExpr) without overflowing */
          testcase( pIdx->nColumn==BMS-2 );
          testcase( pIdx->nColumn==BMS-1 );
          if( pIdx->nColumn>=BMS-1 ) continue;
          if( mustBeUnique ){
            if( pIdx->nKeyCol>nExpr
             ||(pIdx->nColumn>nExpr && !IsUniqueIndex(pIdx))
            ){
              continue;  /* This index is not unique over the IN RHS columns */
            }
          }

          colUsed = 0;   /* Columns of index used so far */
          for(i=0; i<nExpr; i++){
            Expr *pLhs = sqlite3VectorFieldSubexpr(pX->pLeft, i);
            Expr *pRhs = pEList->a[i].pExpr;
            CollSeq *pReq = sqlite3BinaryCompareCollSeq(pParse, pLhs, pRhs);
            int j;

            for(j=0; j<nExpr; j++){
              if( pIdx->aiColumn[j]!=pRhs->iColumn ) continue;
              assert( pIdx->azColl[j] );
              if( pReq!=0 && sqlite3StrICmp(pReq->zName, pIdx->azColl[j])!=0 ){
                continue;
              }
              break;
            }
            if( j==nExpr ) break;
            mCol = MASKBIT(j);
            if( mCol & colUsed ) break; /* Each column used only once */
            colUsed |= mCol;
            if( aiMap ) aiMap[i] = j;
          }

          assert( nExpr>0 && nExpr<BMS );
          assert( i==nExpr || colUsed!=(MASKBIT(nExpr)-1) );
          if( colUsed==(MASKBIT(nExpr)-1) ){
            /* If we reach this point, that means the index pIdx is usable */
            int iAddr = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
            ExplainQueryPlan((pParse, 0,
                              "USING INDEX %s FOR IN-OPERATOR",pIdx->zName));
            sqlite3VdbeAddOp3(v, OP_OpenRead, iTab, pIdx->tnum, iDb);
            sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
            VdbeComment((v, "%s", pIdx->zName));
            assert( IN_INDEX_INDEX_DESC == IN_INDEX_INDEX_ASC+1 );
            eType = IN_INDEX_INDEX_ASC + pIdx->aSortOrder[0];

            if( prRhsHasNull ){
#ifdef SQLITE_ENABLE_COLUMN_USED_MASK
              i64 mask = (1<<nExpr)-1;
              sqlite3VdbeAddOp4Dup8(v, OP_ColumnsUsed,
                  iTab, 0, 0, (u8*)&mask, P4_INT64);
#endif
              *prRhsHasNull = ++pParse->nMem;
              if( nExpr==1 ){
                sqlite3SetHasNullFlag(v, iTab, *prRhsHasNull);
              }
            }
            sqlite3VdbeJumpHere(v, iAddr);
          }
        } /* End loop over indexes */
      } /* End if( affinity_ok ) */
    } /* End if not an rowid index */
  } /* End attempt to optimize using an index */

  /* If no preexisting index is available for the IN clause
  ** and IN_INDEX_NOOP is an allowed reply
  ** and the RHS of the IN operator is a list, not a subquery
  ** and the RHS is not constant or has two or fewer terms,
  ** then it is not worth creating an ephemeral table to evaluate
  ** the IN operator so return IN_INDEX_NOOP.
  */
  if( eType==0
   && (inFlags & IN_INDEX_NOOP_OK)
   && ExprUseXList(pX)
   && (!sqlite3InRhsIsConstant(pParse,pX) || pX->x.pList->nExpr<=2)
  ){
    pParse->nTab--;  /* Back out the allocation of the unused cursor */
    iTab = -1;       /* Cursor is not allocated */
    eType = IN_INDEX_NOOP;
  }

  if( eType==0 ){
    /* Could not find an existing table or index to use as the RHS b-tree.
    ** We will have to generate an ephemeral table to do the job.
    */
    u32 savedNQueryLoop = pParse->nQueryLoop;
    int rMayHaveNull = 0;
    eType = IN_INDEX_EPH;
    if( inFlags & IN_INDEX_LOOP ){
      pParse->nQueryLoop = 0;
    }else if( prRhsHasNull ){
      *prRhsHasNull = rMayHaveNull = ++pParse->nMem;
    }
    assert( pX->op==TK_IN );
    sqlite3CodeRhsOfIN(pParse, pX, iTab);
    if( rMayHaveNull ){
      sqlite3SetHasNullFlag(v, iTab, rMayHaveNull);
    }
    pParse->nQueryLoop = savedNQueryLoop;
  }

  if( aiMap && eType!=IN_INDEX_INDEX_ASC && eType!=IN_INDEX_INDEX_DESC ){
    int i, n;
    n = sqlite3ExprVectorSize(pX->pLeft);
    for(i=0; i<n; i++) aiMap[i] = i;
  }
  *piTab = iTab;
  return eType;
}